

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_init_message(mg_session *session,mg_message_init **message)

{
  int iVar1;
  undefined8 *in_RSI;
  mg_map **in_RDI;
  mg_message_init *tmessage;
  mg_map *auth_token;
  int status;
  int status_1;
  mg_string *client_name;
  mg_allocator *in_stack_ffffffffffffffc8;
  mg_map *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  _func_void_ptr_mg_allocator_ptr_size_t *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_read_string
                    ((mg_session *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                     (mg_string **)in_stack_ffffffffffffffd0);
  if (iVar1 == 0) {
    iVar1 = mg_session_read_map((mg_session *)
                                CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                               );
    if (iVar1 == 0) {
      in_stack_ffffffffffffffc8 =
           (mg_allocator *)
           mg_allocator_malloc((mg_allocator *)in_stack_ffffffffffffffd0,
                               (size_t)in_stack_ffffffffffffffc8);
      if (in_stack_ffffffffffffffc8 != (mg_allocator *)0x0) {
        in_stack_ffffffffffffffc8->malloc = local_20;
        in_stack_ffffffffffffffc8->realloc =
             (_func_void_ptr_mg_allocator_ptr_void_ptr_size_t *)in_stack_ffffffffffffffd0;
        *in_RSI = in_stack_ffffffffffffffc8;
        return 0;
      }
      iVar1 = -3;
      mg_map_destroy_ca(in_stack_ffffffffffffffd0,(mg_allocator *)0x0);
    }
    else {
      mg_string_destroy_ca((mg_string *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    mg_string_destroy_ca((mg_string *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return iVar1;
}

Assistant:

int mg_session_read_init_message(mg_session *session,
                                 mg_message_init **message) {
  mg_string *client_name;
  MG_RETURN_IF_FAILED(mg_session_read_string(session, &client_name));

  int status = 0;

  mg_map *auth_token;
  status = mg_session_read_map(session, &auth_token);
  if (status != 0) {
    mg_string_destroy_ca(client_name, session->decoder_allocator);
    goto cleanup_client_name;
  }

  mg_message_init *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_init));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->client_name = client_name;
  tmessage->auth_token = auth_token;
  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(auth_token, session->decoder_allocator);

cleanup_client_name:
  mg_string_destroy_ca(client_name, session->decoder_allocator);
  return status;
}